

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O1

VectorU __thiscall anurbs::HilbertCurve<2L>::point_at(HilbertCurve<2L> *this,size_t m,size_t h)

{
  bool bVar1;
  uint uVar2;
  Index j_1;
  ulong uVar3;
  size_t sVar4;
  byte bVar5;
  Index j;
  long lVar6;
  size_t extraout_RDX;
  ulong i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ActualDstType actualDst;
  long lVar10;
  VectorU VVar11;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  sVar4 = h;
  if (-1 < (long)(m - 1)) {
    lVar8 = m * 2;
    uVar9 = 0;
    uVar2 = 0;
    lVar10 = m - 1;
    do {
      lVar8 = lVar8 + -2;
      lVar6 = 0;
      i = 0;
      do {
        i = i + ((ulong)((h >> ((ulong)(uint)((int)lVar8 + (int)lVar6) & 0x3f) & 1) != 0) <<
                ((byte)lVar6 & 0x3f));
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      bVar5 = (byte)uVar2 ^ 1;
      uVar7 = ((uint)(uVar9 >> bVar5) | (int)uVar9 << (2 - bVar5 & 0x1f)) & 3 ^ i ^ i >> 1;
      uVar3 = 0;
      do {
        *(ulong *)(this + uVar3 * 8) =
             *(long *)(this + uVar3 * 8) +
             ((ulong)(((((uint)(uVar7 >> bVar5) | (int)uVar7 << (2 - bVar5 & 0x1f)) & 3) >>
                       (uVar3 & 0x3f) & 1) != 0) << ((byte)lVar10 & 0x3f));
        uVar3 = uVar3 + 1;
      } while (uVar3 == 1);
      uVar3 = 0;
      if (i != 0) {
        uVar3 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
      }
      bVar5 = (byte)uVar2 ^ 1;
      uVar9 = uVar9 ^ ((uint)(uVar3 << bVar5) | (uint)(uVar3 >> (2 - bVar5 & 0x3f))) & 3;
      sVar4 = d(i);
      uVar2 = ~((int)sVar4 + uVar2) & 1;
      bVar1 = 0 < lVar10;
      sVar4 = extraout_RDX;
      lVar10 = lVar10 + -1;
    } while (bVar1);
  }
  VVar11.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [1] = sVar4;
  VVar11.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [0] = (unsigned_long)this;
  return (VectorU)VVar11.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.
                  m_storage.m_data.array;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }